

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

int skipcomment(FILE *f,int *cp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = getc((FILE *)f);
  if (iVar1 == 0xef) {
    iVar1 = getc((FILE *)f);
    iVar3 = 0;
    iVar2 = 0xef;
    if ((iVar1 != 0xbb) || (iVar1 = getc((FILE *)f), iVar1 != 0xbf)) goto LAB_0011a9c4;
    iVar1 = getc((FILE *)f);
  }
  *cp = iVar1;
  if (iVar1 != 0x23) {
    return 0;
  }
  do {
    iVar1 = getc((FILE *)f);
    if (iVar1 == 10) break;
  } while (iVar1 != -1);
  iVar2 = getc((FILE *)f);
  iVar3 = 1;
LAB_0011a9c4:
  *cp = iVar2;
  return iVar3;
}

Assistant:

static int skipcomment (FILE *f, int *cp) {
  int c = *cp = skipBOM(f);
  if (c == '#') {  /* first line is a comment (Unix exec. file)? */
    do {  /* skip first line */
      c = getc(f);
    } while (c != EOF && c != '\n');
    *cp = getc(f);  /* next character after comment, if present */
    return 1;  /* there was a comment */
  }
  else return 0;  /* no comment */
}